

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  undefined1 auVar7 [16];
  unsigned___int128 uVar8;
  char cVar9;
  int iVar10;
  numpunct *pnVar11;
  buffer_appender<char> bVar12;
  long *plVar13;
  buffer<char> *buf;
  uint uVar14;
  long lVar15;
  long *plVar16;
  uint uVar17;
  char *pcVar19;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  string groups;
  char digits [40];
  long *local_2a0;
  long local_298;
  long local_290 [2];
  undefined8 local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong uVar18;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_2a0,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_298 == 0) {
    on_dec(this);
  }
  else {
    plVar5 = (locale *)(this->locale).locale_;
    if (plVar5 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar5);
    }
    pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar9 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
    std::locale::~locale((locale *)&local_248);
    if (cVar9 == '\0') {
      on_dec(this);
    }
    else {
      puVar1 = &this->abs_value;
      uVar8 = *puVar1;
      uVar20 = *(ulong *)((long)&this->abs_value + 8);
      auVar7 = (undefined1  [16])*puVar1;
      auVar25 = (undefined1  [16])*puVar1;
      local_280 = 1;
      if (((ulong)uVar8 < 10) <= uVar20) {
        local_280 = 4;
        auVar24 = auVar25;
        do {
          uVar23 = auVar24._8_8_;
          uVar18 = auVar24._0_8_;
          iVar10 = (int)local_280;
          if (uVar23 == 0 && (ulong)(99 < uVar18) <= -uVar23) {
            local_280 = (ulong)(iVar10 - 2);
            goto LAB_0011ab73;
          }
          if (uVar23 == 0 && (ulong)(999 < uVar18) <= -uVar23) {
            local_280 = (ulong)(iVar10 - 1);
            goto LAB_0011ab73;
          }
          if (uVar23 < (uVar18 < 10000)) goto LAB_0011ab73;
          auVar24 = __udivti3(uVar18,uVar23,10000,0);
          local_280 = (ulong)(iVar10 + 4);
        } while (uVar23 != 0 || -uVar23 < (ulong)(99999 < uVar18));
        local_280 = (ulong)(iVar10 + 1);
      }
LAB_0011ab73:
      plVar16 = (long *)((long)local_2a0 + local_298);
      uVar14 = (uint)local_280;
      plVar13 = local_2a0;
      uVar23 = local_280;
      uVar22 = uVar14;
      if (local_298 != 0) {
        lVar15 = local_298;
        uVar18 = local_280;
        do {
          uVar22 = (uint)uVar18;
          cVar3 = (char)*plVar13;
          uVar17 = uVar22 - (int)cVar3;
          uVar18 = (ulong)uVar17;
          if ((uVar17 == 0 || (int)uVar22 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
          goto LAB_0011abc2;
          uVar23 = (ulong)((int)uVar23 + 1);
          plVar13 = (long *)((long)plVar13 + 1);
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        plVar13 = plVar16;
        uVar23 = (ulong)((int)local_298 + uVar14);
        uVar22 = uVar17;
      }
LAB_0011abc2:
      iVar10 = (int)uVar23;
      if (plVar13 == plVar16) {
        iVar10 = (int)(uVar22 - 1) / (int)*(char *)((long)plVar16 + -1) + iVar10;
      }
      pcVar21 = local_278 + (int)uVar14;
      pcVar19 = pcVar21;
      if (((ulong)uVar8 < 100) <= uVar20) {
        do {
          lVar15 = auVar25._8_8_;
          uVar20 = auVar25._0_8_;
          pcVar21 = pcVar19 + -2;
          auVar25 = __udivti3(uVar20,lVar15,100,0);
          *(undefined2 *)(pcVar19 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar20 + auVar25._0_8_ * -100) * 2);
          pcVar19 = pcVar21;
          auVar7 = auVar25;
        } while (lVar15 != 0 || (ulong)-lVar15 < (ulong)(9999 < uVar20));
      }
      uVar20 = local_280;
      if (auVar7._8_8_ == 0 && (ulong)(9 < auVar7._0_8_) <= (ulong)-auVar7._8_8_) {
        pcVar21[-1] = auVar7[0] | 0x30;
      }
      else {
        *(undefined2 *)(pcVar21 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar7._0_8_ * 2)
        ;
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0013b750;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar22 = iVar10 + this->prefix_size;
      uVar23 = (ulong)uVar22;
      if (500 < uVar22) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar23);
      }
      pcVar21 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar23 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar23;
      }
      pcVar19 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar22 + -1;
      if (1 < (int)uVar20) {
        lVar15 = (uVar20 & 0xffffffff) + 1;
        iVar10 = 0;
        plVar16 = local_2a0;
        do {
          pcVar2 = pcVar19 + -1;
          *pcVar19 = local_278[lVar15 + -2];
          cVar3 = (char)*plVar16;
          if ('\0' < cVar3) {
            iVar10 = iVar10 + 1;
            if ((cVar3 != '\x7f') && (iVar10 % (int)cVar3 == 0)) {
              if ((long *)((long)plVar16 + 1) != (long *)((long)local_2a0 + local_298)) {
                iVar10 = 0;
                plVar16 = (long *)((long)plVar16 + 1);
              }
              pcVar19[-1] = cVar9;
              pcVar2 = pcVar19 + -2;
            }
          }
          pcVar19 = pcVar2;
          lVar15 = lVar15 + -1;
        } while (2 < lVar15);
      }
      *pcVar19 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar19[-1] = '-';
      }
      pbVar6 = this->specs;
      uVar20 = 0;
      if (uVar23 <= (uint)pbVar6->width) {
        uVar20 = (uint)pbVar6->width - uVar23;
      }
      bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar6->field_0x9 & 0xf));
      if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar23 + (pbVar6->fill).size_ * uVar20) {
        (*(code *)**(undefined8 **)
                    bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar23 = uVar20 >> (bVar4 & 0x3f);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar23,&pbVar6->fill);
      bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar21,pcVar21 + (int)uVar22,bVar12);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar12,uVar20 - uVar23,&pbVar6->fill);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
    }
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }